

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O3

SynModule * Parse(ParseContext *ctx,char *code,char *moduleRoot)

{
  Lexer *this;
  uint uVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  Lexeme *pLVar5;
  SynModule *pSVar6;
  TraceScope traceScope;
  TraceScope TStack_38;
  
  if ((Parse(ParseContext&,char_const*,char_const*)::token == '\0') &&
     (iVar4 = __cxa_guard_acquire(&Parse(ParseContext&,char_const*,char_const*)::token), iVar4 != 0)
     ) {
    Parse::token = NULLC::TraceGetToken("parser","Parse");
    __cxa_guard_release(&Parse(ParseContext&,char_const*,char_const*)::token);
  }
  NULLC::TraceScope::TraceScope(&TStack_38,Parse::token);
  ctx->code = code;
  ctx->moduleRoot = moduleRoot;
  uVar3 = NULLCTime::clockMicro();
  (ctx->statistics).startTime = uVar3;
  (ctx->statistics).finishTime = 0;
  this = &ctx->lexer;
  Lexer::Lexify(this,code);
  uVar3 = NULLCTime::clockMicro();
  CompilerStatistics::Finish(&ctx->statistics,"Lexer",uVar3);
  uVar3 = *(uint *)(NULLC::traceContext + 0x244);
  iVar4 = _setjmp((__jmp_buf_tag *)ctx->errorHandler);
  lVar2 = NULLC::traceContext;
  if (iVar4 == 0) {
    uVar3 = Lexer::GetStreamSize(this);
    if (uVar3 == 0) {
      __assert_fail("ctx.lexer.GetStreamSize() != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ParseTree.cpp"
                    ,0xc8a,"SynModule *Parse(ParseContext &, const char *, const char *)");
    }
    ctx->errorHandlerActive = true;
    pLVar5 = Lexer::GetStreamStart(this);
    ctx->firstLexeme = pLVar5;
    pLVar5 = Lexer::GetStreamStart(this);
    ctx->currentLexeme = pLVar5;
    pLVar5 = Lexer::GetStreamStart(this);
    uVar3 = Lexer::GetStreamSize(this);
    ctx->lastLexeme = pLVar5 + (uVar3 - 1);
    pSVar6 = ParseModule(ctx);
    ctx->errorHandlerActive = false;
  }
  else {
    uVar1 = *(uint *)(NULLC::traceContext + 0x244);
    while (uVar3 < uVar1) {
      NULLC::TraceLeave(0.0,0,0);
      uVar1 = *(uint *)(lVar2 + 0x244);
    }
    if (ctx->errorPos == (char *)0x0) {
      __assert_fail("ctx.errorPos",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ParseTree.cpp"
                    ,0xc9f,"SynModule *Parse(ParseContext &, const char *, const char *)");
    }
    pSVar6 = (SynModule *)0x0;
  }
  ctx->code = (char *)0x0;
  ctx->moduleRoot = (char *)0x0;
  NULLC::TraceScope::~TraceScope(&TStack_38);
  return pSVar6;
}

Assistant:

SynModule* Parse(ParseContext &ctx, const char *code, const char *moduleRoot)
{
	TRACE_SCOPE("parser", "Parse");

	ctx.code = code;

	ctx.moduleRoot = moduleRoot;

	ctx.statistics.Start(NULLCTime::clockMicro());

	ctx.lexer.Lexify(code);

	ctx.statistics.Finish("Lexer", NULLCTime::clockMicro());

	unsigned traceDepth = NULLC::TraceGetDepth();

	if(!setjmp(ctx.errorHandler))
	{
		assert(ctx.lexer.GetStreamSize() != 0);

		ctx.errorHandlerActive = true;

		ctx.firstLexeme = ctx.lexer.GetStreamStart();
		ctx.currentLexeme = ctx.lexer.GetStreamStart();
		ctx.lastLexeme = ctx.lexer.GetStreamStart() + (ctx.lexer.GetStreamSize() - 1);

		SynModule *module = ParseModule(ctx);

		ctx.errorHandlerActive = false;

		ctx.code = NULL;

		ctx.moduleRoot = NULL;

		return module;
	}

	NULLC::TraceLeaveTo(traceDepth);

	assert(ctx.errorPos);

	ctx.code = NULL;

	ctx.moduleRoot = NULL;

	return NULL;
}